

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,REF_DBL *hessian)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  REF_DBL *m;
  undefined1 local_98 [16];
  double local_88;
  
  ref_node = ref_grid->node;
  lVar4 = 0;
  m = hessian;
  do {
    if (ref_node->max <= lVar4) {
      uVar2 = ref_node_ghost_dbl(ref_node,hessian,6);
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        pcVar5 = "update ghosts";
        uVar3 = 0x55f;
LAB_001c4967:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               uVar3,"ref_recon_abs_value_hessian",(ulong)uVar2,pcVar5);
      }
      return uVar2;
    }
    if ((-1 < ref_node->global[lVar4]) && (ref_node->ref_mpi->id == ref_node->part[lVar4])) {
      uVar2 = ref_matrix_diag_m(m,(REF_DBL *)local_98);
      if (uVar2 != 0) {
        pcVar5 = "decomp";
        uVar3 = 0x557;
        goto LAB_001c4967;
      }
      auVar1._8_8_ = local_98._8_8_ ^ 0x8000000000000000;
      auVar1._0_8_ = local_98._0_8_ ^ 0x8000000000000000;
      local_98 = maxpd(local_98,auVar1);
      if (local_88 <= -local_88) {
        local_88 = -local_88;
      }
      uVar2 = ref_matrix_form_m((REF_DBL *)local_98,m);
      if (uVar2 != 0) {
        pcVar5 = "re-form";
        uVar3 = 0x55b;
        goto LAB_001c4967;
      }
    }
    lVar4 = lVar4 + 1;
    m = m + 6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,
                                               REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m(&(hessian[6 * node]), diag_system), "decomp");
      ref_matrix_eig(diag_system, 0) = ABS(ref_matrix_eig(diag_system, 0));
      ref_matrix_eig(diag_system, 1) = ABS(ref_matrix_eig(diag_system, 1));
      ref_matrix_eig(diag_system, 2) = ABS(ref_matrix_eig(diag_system, 2));
      RSS(ref_matrix_form_m(diag_system, &(hessian[6 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");

  return REF_SUCCESS;
}